

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O3

bool tinyusdz::tydra::anon_unknown_0::ComputeTangentsAndBinormals
               (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *vertices,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,
               vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *texcoords,
               vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *normals,
               bool is_facevarying_input,
               vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *tangents,
               vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *binormals,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *out_vertex_indices,string *err)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  pointer paVar10;
  pointer paVar11;
  pointer paVar12;
  undefined4 uVar13;
  int iVar14;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __result;
  ostream *poVar15;
  ulong uVar16;
  pointer puVar17;
  uint *puVar18;
  uint uVar19;
  uint *puVar20;
  pointer paVar21;
  pointer paVar22;
  pointer puVar23;
  long lVar24;
  size_t __n;
  array<float,_3UL> *__args;
  array<float,_2UL> *__args_00;
  uint *puVar25;
  int iVar26;
  size_type __n_00;
  char *pcVar27;
  uint uVar28;
  pointer paVar29;
  pointer paVar30;
  long lVar31;
  ulong uVar32;
  uint uVar33;
  pointer paVar34;
  pointer paVar35;
  bool bVar36;
  bool bVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  normal3f nVar50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertex_indices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertex_point_indices;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> v_tn;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> bn;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> tn;
  normal3f local_2e8;
  undefined1 local_2d8 [24];
  pointer paStack_2c0;
  pointer local_2b8;
  pointer paStack_2b0;
  pointer local_2a8;
  pointer paStack_2a0;
  pointer local_298;
  pointer local_290;
  ulong local_288;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *local_280;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_278;
  pointer local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined1 local_248 [8];
  pointer puStack_240;
  pointer local_238;
  undefined1 local_228 [24];
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> vStack_210;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> local_1f8 [2];
  ios_base local_1b8 [264];
  ulong local_b0;
  ulong local_a8;
  pointer local_a0;
  ulong local_98;
  pointer local_90;
  ulong local_88;
  ulong local_80;
  pointer local_78;
  pointer local_70;
  pointer local_68;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> local_60;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> local_48;
  
  if (tangents == (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
    poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_228,0x74f);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
    pcVar27 = "tangents arg is nullptr.";
    lVar24 = 0x18;
LAB_003422a0:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,pcVar27,lVar24);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
    if (err == (string *)0x0) goto LAB_003422ff;
    ::std::__cxx11::stringbuf::str();
  }
  else {
    if (binormals == (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x0
       ) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
      poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_228,0x753);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
      pcVar27 = "binormals arg is nullptr.";
      lVar24 = 0x19;
      goto LAB_003422a0;
    }
    if (out_vertex_indices == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
      poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_228,0x757);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
      pcVar27 = "out_indices arg is nullptr.";
      lVar24 = 0x1b;
      goto LAB_003422a0;
    }
    paVar34 = (vertices->
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    paVar30 = (vertices->
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (paVar34 == paVar30) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
      poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_228,0x75b);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
      pcVar27 = "vertices is empty.";
LAB_0034229b:
      lVar24 = 0x12;
      goto LAB_003422a0;
    }
    puVar18 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_start;
    puVar25 = (faceVertexIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    __n_00 = (long)puVar25 - (long)puVar18 >> 2;
    if (__n_00 < 3) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
      poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_228,0x760);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
      pcVar27 = "faceVertexIndices.size < 3";
      lVar24 = 0x1a;
      goto LAB_003422a0;
    }
    paVar10 = (texcoords->
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    paVar21 = (texcoords->
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (paVar10 == paVar21) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
      poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_228,0x764);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
      pcVar27 = "texcoords is empty";
      goto LAB_0034229b;
    }
    paVar11 = (normals->
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    paVar12 = (normals->
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    local_258 = paVar10;
    if (paVar11 == paVar12) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                 ,0x5b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
      poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_228,0x768);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
      pcVar27 = "normals is empty";
      lVar24 = 0x10;
      goto LAB_003422a0;
    }
    local_290 = paVar11;
    if (is_facevarying_input) {
      if (((long)paVar30 - (long)paVar34 >> 2) * -0x5555555555555555 - __n_00 == 0) {
        if ((long)paVar21 - (long)paVar10 >> 3 != __n_00) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
          iVar26 = 0x770;
          goto LAB_003427e0;
        }
        if (((long)paVar12 - (long)paVar11 >> 2) * -0x5555555555555555 - __n_00 != 0) {
          local_280 = normals;
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                     ,0x5b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
          iVar26 = 0x773;
          goto LAB_00342c9f;
        }
LAB_0034247a:
        local_70 = (faceVertexCounts->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        local_78 = (faceVertexCounts->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        if ((local_78 != local_70) || (__n_00 == (__n_00 / 3) * 3)) {
          local_280 = normals;
          ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
          vector(&local_48,__n_00,(allocator_type *)local_228);
          __n = (long)local_48.
                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_48.
                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          if (__n != 0) {
            memset(local_48.
                   super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                   ._M_impl.super__Vector_impl_data._M_start,0,__n);
            ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            vector(&local_60,
                   (long)(faceVertexIndices->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(faceVertexIndices->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2,(allocator_type *)local_228);
            __n = (long)local_60.
                        super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_60.
                        super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            if (__n != 0) {
              memset(local_60.
                     super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                     ._M_impl.super__Vector_impl_data._M_start,0,__n);
              puVar17 = (faceVertexCounts->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              lVar24 = (long)(faceVertexCounts->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar17;
              if (lVar24 == 0) {
                bVar36 = true;
              }
              else {
                local_98 = lVar24 >> 2;
                local_a0 = (faceVertexIndices->
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                local_a8 = (long)(faceVertexIndices->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)local_a0 >> 2;
                local_260 = (vertices->
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                local_258 = (pointer)(((long)(vertices->
                                             super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_260 >> 2) * -0x5555555555555555);
                local_b0 = local_98 + (local_98 == 0);
                local_a0 = local_a0 + 2;
                bVar36 = false;
                local_288 = 0;
                uVar32 = 0;
                do {
                  local_90 = puVar17;
                  if (local_78 != local_70) {
                    uVar19 = puVar17[uVar32];
                    uVar16 = local_288 + uVar19;
                    if (local_a8 <= uVar16) goto LAB_0034357d;
                    if (2 < uVar19) {
                      paVar34 = (pointer)((ulong)uVar19 - 2);
                      goto LAB_0034298b;
                    }
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_228,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_228,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                               ,0x5b);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_228,"():",3);
                    poVar15 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_228,0x7a1);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                    pcVar27 = "Degenerated facet found.";
                    lVar24 = 0x18;
LAB_003434ba:
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_228,pcVar27,lVar24);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_228,"\n",1);
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::__cxx11::string::_M_append((char *)err,local_2d8._0_8_);
                      if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
                        operator_delete((void *)local_2d8._0_8_,
                                        (ulong)((long)(float *)local_2d8._16_8_ + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
                    ::std::ios_base::~ios_base(local_1b8);
                    goto LAB_0034353a;
                  }
                  uVar16 = local_288 + 3;
                  paVar34 = (pointer)0x1;
                  if (local_a8 <= uVar16) {
LAB_0034357d:
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_228,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_228,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                               ,0x5b);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_228,"():",3);
                    poVar15 = (ostream *)
                              ::std::ostream::operator<<((ostringstream *)local_228,0x79d);
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                    pcVar27 = "Invalid value in faceVertexOffset.";
                    lVar24 = 0x22;
                    goto LAB_003434ba;
                  }
LAB_0034298b:
                  paVar10 = (texcoords->
                            super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  paVar21 = (pointer)((long)(texcoords->
                                            super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)paVar10 >> 3);
                  lVar24 = local_288 * 3 + 8;
                  local_68 = local_a0 + local_288;
                  paVar30 = (pointer)0x0;
                  do {
                    if (is_facevarying_input) {
                      iVar26 = (int)local_288;
                      iVar14 = (int)paVar30;
                      uVar19 = iVar26 + iVar14;
                      uVar33 = iVar26 + iVar14 + 1;
                      uVar28 = iVar26 + iVar14 + 2;
                    }
                    else {
                      uVar19 = local_68[(long)((long)paVar30[-1]._M_elems + 10)];
                      uVar33 = local_68[(long)((long)paVar30[-1]._M_elems + 0xb)];
                      uVar28 = local_68[(long)paVar30];
                    }
                    paVar22 = (pointer)(ulong)uVar19;
                    local_290 = paVar34;
                    local_88 = uVar16;
                    local_80 = uVar32;
                    if (((local_258 <= paVar22) ||
                        (paVar35 = (pointer)(ulong)uVar33, local_258 <= paVar35)) ||
                       (paVar29 = (pointer)(ulong)uVar28, local_258 <= paVar29)) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 ,0x5b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,"():",3);
                      poVar15 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_228,0x7c2);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                      pcVar27 = "Invalid value in faceVertexIndices. some exceeds vertices.size()";
                      lVar24 = 0x40;
                      goto LAB_003434ba;
                    }
                    if (((paVar21 <= paVar29) || (paVar21 <= paVar22)) || (paVar21 <= paVar35)) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,"[error]",7);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 ,0x5b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,":",1);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
                      ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_228,"():",3);
                      poVar15 = (ostream *)
                                ::std::ostream::operator<<((ostringstream *)local_228,0x7df);
                      ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
                      pcVar27 = "Invalid index. some exceeds texcoords.size()";
                      lVar24 = 0x2c;
                      goto LAB_003434ba;
                    }
                    fVar38 = paVar10[(long)paVar35]._M_elems[0] - paVar10[(long)paVar22]._M_elems[0]
                    ;
                    fVar40 = paVar10[(long)paVar29]._M_elems[0] - paVar10[(long)paVar22]._M_elems[0]
                    ;
                    fVar42 = paVar10[(long)paVar35]._M_elems[1] - paVar10[(long)paVar22]._M_elems[1]
                    ;
                    fVar41 = paVar10[(long)paVar29]._M_elems[1] - paVar10[(long)paVar22]._M_elems[1]
                    ;
                    fVar43 = fVar38 * fVar41 - fVar42 * fVar40;
                    fVar39 = 1.0;
                    if (1e-20 < ABS(fVar43)) {
                      fVar39 = 1.0 / fVar43;
                    }
                    fVar47 = local_260[(long)paVar35]._M_elems[2] -
                             local_260[(long)paVar22]._M_elems[2];
                    fVar43 = local_260[(long)paVar29]._M_elems[2] -
                             local_260[(long)paVar22]._M_elems[2];
                    fVar44 = (fVar41 * fVar47 - fVar43 * fVar42) * fVar39;
                    fVar47 = (fVar38 * fVar43 - fVar47 * fVar40) * fVar39;
                    fVar45 = (float)*(undefined8 *)local_260[(long)paVar22]._M_elems;
                    fVar48 = (float)*(undefined8 *)local_260[(long)paVar35]._M_elems - fVar45;
                    fVar46 = (float)((ulong)*(undefined8 *)local_260[(long)paVar22]._M_elems >> 0x20
                                    );
                    fVar49 = (float)((ulong)*(undefined8 *)local_260[(long)paVar35]._M_elems >> 0x20
                                    ) - fVar46;
                    fVar45 = (float)*(undefined8 *)local_260[(long)paVar29]._M_elems - fVar45;
                    fVar46 = (float)((ulong)*(undefined8 *)local_260[(long)paVar29]._M_elems >> 0x20
                                    ) - fVar46;
                    fVar43 = (fVar41 * fVar48 - fVar42 * fVar45) * fVar39;
                    fVar41 = (fVar41 * fVar49 - fVar42 * fVar46) * fVar39;
                    *(ulong *)((long)local_48.
                                     super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar24 * 4 + -0x20)
                         = CONCAT44(fVar41,fVar43);
                    (&local_48.
                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      ._M_impl.super__Vector_impl_data._M_start[-2].x)[lVar24] = fVar44;
                    *(ulong *)((long)local_48.
                                     super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar24 * 4 + -0x14)
                         = CONCAT44(fVar41,fVar43);
                    (&local_48.
                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].x)[lVar24] = fVar44;
                    *(ulong *)((long)local_48.
                                     super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar24 * 4 + -8) =
                         CONCAT44(fVar41,fVar43);
                    (&(local_48.
                       super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       ._M_impl.super__Vector_impl_data._M_start)->x)[lVar24] = fVar44;
                    fVar41 = (fVar38 * fVar45 - fVar40 * fVar48) * fVar39;
                    fVar39 = (fVar38 * fVar46 - fVar40 * fVar49) * fVar39;
                    *(ulong *)((long)local_60.
                                     super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar24 * 4 + -0x20)
                         = CONCAT44(fVar39,fVar41);
                    (&local_60.
                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      ._M_impl.super__Vector_impl_data._M_start[-2].x)[lVar24] = fVar47;
                    *(ulong *)((long)local_60.
                                     super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar24 * 4 + -0x14)
                         = CONCAT44(fVar39,fVar41);
                    (&local_60.
                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].x)[lVar24] = fVar47;
                    *(ulong *)((long)local_60.
                                     super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar24 * 4 + -8) =
                         CONCAT44(fVar39,fVar41);
                    (&(local_60.
                       super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                       ._M_impl.super__Vector_impl_data._M_start)->x)[lVar24] = fVar47;
                    paVar30 = (pointer)((long)paVar30->_M_elems + 1);
                    lVar24 = lVar24 + 3;
                  } while (paVar34 != paVar30);
                  uVar32 = uVar32 + 1;
                  bVar36 = local_98 <= uVar32;
                  local_288 = uVar16;
                } while (uVar32 != local_b0);
              }
              local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start = (uint *)0x0;
              local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = (uint *)0x0;
              local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_1f8[0].
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (array<float,_2UL> *)0x0;
              local_1f8[0].
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_1f8[0].
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (array<float,_2UL> *)0x0;
              vStack_210.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (array<float,_3UL> *)0x0;
              vStack_210.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (array<float,_3UL> *)0x0;
              local_228._16_8_ = (pointer)0x0;
              vStack_210.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_228._0_8_ = (pointer)0x0;
              local_228._8_8_ = (pointer)0x0;
              local_298 = (pointer)0x0;
              local_2a8 = (pointer)0x0;
              paStack_2a0 = (pointer)0x0;
              local_2b8 = (pointer)0x0;
              paStack_2b0 = (pointer)0x0;
              local_2d8._16_8_ = (pointer)0x0;
              paStack_2c0 = (pointer)0x0;
              local_2d8._0_8_ = (pointer)0x0;
              local_2d8._8_8_ = (pointer)0x0;
              puVar17 = (faceVertexIndices->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              puVar23 = (faceVertexIndices->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_finish;
              if (is_facevarying_input) {
                if (puVar23 != puVar17) {
                  lVar24 = 0;
                  uVar32 = 0;
                  do {
                    if (local_228._8_8_ == local_228._16_8_) {
                      ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
                      _M_realloc_insert<unsigned_int_const&>
                                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_228,
                                 (iterator)local_228._8_8_,(uint *)((long)puVar17 + lVar24));
                      puVar17 = (faceVertexIndices->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start;
                      puVar23 = (faceVertexIndices->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish;
                    }
                    else {
                      *(uint *)local_228._8_8_ = *(uint *)((long)puVar17 + lVar24);
                      local_228._8_8_ = local_228._8_8_ + 4;
                    }
                    uVar32 = uVar32 + 1;
                    lVar24 = lVar24 + 4;
                  } while (uVar32 < (ulong)((long)puVar23 - (long)puVar17 >> 2));
                }
                ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                operator=(&vStack_210,local_280);
                ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                operator=(local_1f8,texcoords);
              }
              else if (puVar23 != puVar17) {
                uVar32 = 0;
                do {
                  if (local_228._8_8_ == local_228._16_8_) {
                    ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
                    _M_realloc_insert<unsigned_int_const&>
                              ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_228,
                               (iterator)local_228._8_8_,puVar17 + uVar32);
                    uVar19 = (faceVertexIndices->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar32];
                  }
                  else {
                    uVar19 = puVar17[uVar32];
                    *(uint *)local_228._8_8_ = uVar19;
                    local_228._8_8_ = local_228._8_8_ + 4;
                  }
                  __args = (local_280->
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar19;
                  if (vStack_210.
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      vStack_210.
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>::
                    _M_realloc_insert<std::array<float,3ul>const&>
                              ((vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>
                                *)&vStack_210,
                               (iterator)
                               vStack_210.
                               super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,__args);
                  }
                  else {
                    (vStack_210.
                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[2] = __args->_M_elems[2];
                    *(undefined8 *)
                     (vStack_210.
                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_elems =
                         *(undefined8 *)__args->_M_elems;
                    vStack_210.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         vStack_210.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  __args_00 = (texcoords->
                              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                              )._M_impl.super__Vector_impl_data._M_start +
                              (faceVertexIndices->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar32];
                  if (local_1f8[0].
                      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      local_1f8[0].
                      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>::
                    _M_realloc_insert<std::array<float,2ul>const&>
                              ((vector<std::array<float,2ul>,std::allocator<std::array<float,2ul>>>
                                *)local_1f8,
                               (iterator)
                               local_1f8[0].
                               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,__args_00);
                  }
                  else {
                    *(undefined8 *)
                     (local_1f8[0].
                      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->_M_elems =
                         *(undefined8 *)__args_00->_M_elems;
                    local_1f8[0].
                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         local_1f8[0].
                         super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  uVar32 = uVar32 + 1;
                  puVar17 = (faceVertexIndices->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start;
                } while (uVar32 < (ulong)((long)(faceVertexIndices->
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                )._M_impl.super__Vector_impl_data._M_finish -
                                          (long)puVar17 >> 2));
              }
              local_248 = (undefined1  [8])0x0;
              puStack_240 = (pointer)0x0;
              local_238 = (pointer)0x0;
              BuildIndices<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>,tinyusdz::tydra::(anonymous_namespace)::ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>,tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData,tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexDataHasher,tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexDataEqual>
                        ((ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                          *)local_228,
                         (ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                          *)local_2d8,&local_278,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_248);
              if (local_248 != (undefined1  [8])0x0) {
                operator_delete((void *)local_248,(long)local_238 - (long)local_248);
              }
              ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
              ::~ComputeTangentVertexOutput
                        ((ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                          *)local_2d8);
              ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
              ::~ComputeTangentVertexInput
                        ((ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                          *)local_228);
              puVar25 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start + 1;
              puVar18 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (puVar25 !=
                  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish &&
                  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                uVar19 = *local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                do {
                  uVar33 = *puVar25;
                  bVar37 = uVar19 < uVar33;
                  if (uVar19 <= uVar33) {
                    uVar19 = uVar33;
                  }
                  if (bVar37) {
                    puVar18 = puVar25;
                  }
                  puVar25 = puVar25 + 1;
                } while (puVar25 !=
                         local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
              }
              uVar32 = (ulong)*puVar18;
              local_228._16_8_ = (pointer)0x0;
              local_228._0_8_ = (pointer)0x0;
              local_228._8_8_ = (pointer)0x0;
              local_2d8._0_8_ = (pointer)0x0;
              local_2d8._8_8_ = local_2d8._8_8_ & 0xffffffff00000000;
              ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
              _M_fill_assign((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                              *)local_228,uVar32,(value_type *)local_2d8);
              local_2d8._16_8_ = (pointer)0x0;
              local_2d8._0_8_ = (pointer)0x0;
              local_2d8._8_8_ = (pointer)0x0;
              local_248 = (undefined1  [8])0x0;
              puStack_240 = (pointer)((ulong)puStack_240 & 0xffffffff00000000);
              ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
              _M_fill_assign((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                              *)local_2d8,uVar32,(value_type *)local_248);
              if ((long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start != 0) {
                lVar24 = (long)local_278.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_278.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 2;
                lVar31 = 0;
                do {
                  uVar19 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar31];
                  fVar39 = local_48.
                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar19].z;
                  fVar38 = local_60.
                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar19].z;
                  uVar1 = local_48.
                          super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar19].x;
                  uVar5 = local_48.
                          super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar19].y;
                  uVar2 = ((pointer)(local_228._0_8_ + (ulong)uVar19 * 0xc))->x;
                  uVar6 = ((pointer)(local_228._0_8_ + (ulong)uVar19 * 0xc))->y;
                  fVar40 = ((pointer)(local_228._0_8_ + (ulong)uVar19 * 0xc))->z;
                  uVar3 = local_60.
                          super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar19].x;
                  uVar7 = local_60.
                          super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar19].y;
                  ((pointer)(local_228._0_8_ + (ulong)uVar19 * 0xc))->x =
                       (float)uVar2 + (float)uVar1;
                  ((pointer)(local_228._0_8_ + (ulong)uVar19 * 0xc))->y =
                       (float)uVar6 + (float)uVar5;
                  ((pointer)(local_228._0_8_ + (ulong)uVar19 * 0xc))->z = fVar39 + fVar40;
                  uVar4 = ((pointer)(local_2d8._0_8_ + (ulong)uVar19 * 0xc))->x;
                  uVar8 = ((pointer)(local_2d8._0_8_ + (ulong)uVar19 * 0xc))->y;
                  ((pointer)(local_2d8._0_8_ + (ulong)uVar19 * 0xc))->x =
                       (float)uVar4 + (float)uVar3;
                  ((pointer)(local_2d8._0_8_ + (ulong)uVar19 * 0xc))->y =
                       (float)uVar8 + (float)uVar7;
                  ((pointer)(local_2d8._0_8_ + (ulong)uVar19 * 0xc))->z =
                       fVar38 + ((pointer)(local_2d8._0_8_ + (ulong)uVar19 * 0xc))->z;
                  lVar31 = lVar31 + 1;
                } while (lVar24 + (ulong)(lVar24 == 0) != lVar31);
              }
              if (uVar32 != 0) {
                lVar24 = 0;
                do {
                  fVar39 = vlength((normal3f *)((long)(float *)local_228._0_8_ + lVar24));
                  if (0.0 < fVar39) {
                    nVar50 = vnormalize((normal3f *)((long)(float *)local_228._0_8_ + lVar24),
                                        1.1920929e-07);
                    *(long *)((long)(float *)local_228._0_8_ + lVar24) = nVar50._0_8_;
                    *(float *)((long)(local_228._0_8_ + 8) + lVar24) = nVar50.z;
                  }
                  fVar39 = vlength((normal3f *)((long)(float *)local_2d8._0_8_ + lVar24));
                  if (0.0 < fVar39) {
                    nVar50 = vnormalize((normal3f *)((long)(float *)local_2d8._0_8_ + lVar24),
                                        1.1920929e-07);
                    *(long *)((long)(float *)local_2d8._0_8_ + lVar24) = nVar50._0_8_;
                    *(float *)((long)(local_2d8._0_8_ + 8) + lVar24) = nVar50.z;
                  }
                  lVar24 = lVar24 + 0xc;
                } while (uVar32 * 0xc != lVar24);
              }
              local_248 = (undefined1  [8])0x0;
              puStack_240 = (pointer)((ulong)puStack_240 & 0xffffffff00000000);
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              _M_fill_assign(tangents,uVar32,(value_type *)local_248);
              local_248 = (undefined1  [8])0x0;
              puStack_240 = (pointer)((ulong)puStack_240 & 0xffffffff00000000);
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              _M_fill_assign(binormals,uVar32,(value_type *)local_248);
              if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish !=
                  local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                uVar32 = 0;
                do {
                  uVar19 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar32];
                  paVar34 = (local_280->
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  local_248._0_4_ = paVar34[uVar19]._M_elems[0];
                  local_248._4_4_ = paVar34[uVar19]._M_elems[1];
                  fVar39 = paVar34[uVar19]._M_elems[2];
                  puStack_240 = (pointer)CONCAT44(puStack_240._4_4_,fVar39);
                  uVar9 = ((pointer)(local_228._0_8_ + (ulong)uVar19 * 0xc))->x;
                  uVar13 = ((pointer)(local_228._0_8_ + (ulong)uVar19 * 0xc))->y;
                  local_258 = *(pointer *)
                               (local_2d8._0_8_ +
                               (ulong)local_278.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start[uVar32] * 0xc);
                  uStack_250 = 0;
                  local_290 = (pointer)CONCAT44(local_290._4_4_,
                                                ((pointer)
                                                (local_2d8._0_8_ +
                                                (ulong)local_278.
                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[uVar32]
                                                * 0xc))->z);
                  fVar38 = fVar39 * ((pointer)(local_228._0_8_ + (ulong)uVar19 * 0xc))->z +
                           (float)local_248._0_4_ * (float)uVar9 +
                           (float)uVar13 * (float)local_248._4_4_;
                  local_2e8.z = ((pointer)(local_228._0_8_ + (ulong)uVar19 * 0xc))->z -
                                fVar39 * fVar38;
                  local_2e8._0_8_ =
                       CONCAT44((float)uVar13 - fVar38 * (float)local_248._4_4_,
                                (float)uVar9 - fVar38 * (float)local_248._0_4_);
                  fVar39 = vlength(&local_2e8);
                  if (0.0 < fVar39) {
                    nVar50 = vnormalize(&local_2e8,1.1920929e-07);
                    local_2e8.z = nVar50.z;
                    local_2e8._0_8_ = nVar50._0_8_;
                  }
                  nVar50 = vcross((normal3f *)local_248,&local_2e8);
                  fVar39 = local_2e8.x;
                  if (nVar50.z * local_290._0_4_ +
                      nVar50.x * (float)local_258 + local_258._4_4_ * nVar50.y < 0.0) {
                    fVar39 = -local_2e8.x;
                    local_2e8.z = -local_2e8.z;
                    local_2e8._0_8_ = local_2e8._0_8_ ^ 0x8000000080000000;
                  }
                  uVar19 = local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar32];
                  paVar34 = (tangents->
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  paVar34[uVar19]._M_elems[0] = fVar39;
                  paVar34[uVar19]._M_elems[1] = local_2e8.y;
                  paVar34[uVar19]._M_elems[2] = local_2e8.z;
                  paVar30 = (binormals->
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  paVar34 = paVar30 + uVar19;
                  paVar34->_M_elems[0] = (float)local_258;
                  paVar34->_M_elems[1] = local_258._4_4_;
                  paVar30[uVar19]._M_elems[2] = local_290._0_4_;
                  uVar32 = uVar32 + 1;
                } while (uVar32 < (ulong)((long)local_278.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_278.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 2));
              }
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (out_vertex_indices,&local_278);
              if ((pointer)local_2d8._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ - local_2d8._0_8_);
              }
              if ((pointer)local_228._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_228._0_8_,local_228._16_8_ - local_228._0_8_);
              }
              if (local_278.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != (uint *)0x0) {
                operator_delete(local_278.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_278.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_278.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
LAB_0034353a:
              if (local_60.
                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_60.
                                super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)local_60.
                                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_60.
                                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_48.
                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                  ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
                return bVar36;
              }
              operator_delete(local_48.
                              super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_48.
                                    super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_48.
                                    super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
              return bVar36;
            }
          }
          ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                     ((long)__n >> 2) * -0x5555555555555555);
        }
        local_280 = normals;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
        poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_228,0x789);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
        pcVar27 = 
        "Invalid faceVertexIndices. It must be all triangles: faceVertexIndices.size % 3 == 0";
        lVar24 = 0x54;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
        poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_228,0x76d);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
        pcVar27 = "Invalid vertices.size.";
        lVar24 = 0x16;
      }
      goto LAB_003422a0;
    }
    puVar20 = puVar18 + 1;
    if (puVar20 != puVar25 && puVar18 != puVar25) {
      uVar19 = *puVar18;
      do {
        uVar33 = *puVar20;
        bVar36 = uVar19 < uVar33;
        if (uVar19 <= uVar33) {
          uVar19 = uVar33;
        }
        if (bVar36) {
          puVar18 = puVar20;
        }
        puVar20 = puVar20 + 1;
      } while (puVar20 != puVar25);
    }
    uVar32 = (ulong)*puVar18;
    uVar16 = ((long)paVar30 - (long)paVar34 >> 2) * -0x5555555555555555;
    local_260 = paVar12;
    if (uVar32 <= uVar16 && uVar16 - uVar32 != 0) {
      if (uVar32 < (ulong)((long)paVar21 - (long)paVar10 >> 3)) {
        uVar16 = ((long)paVar12 - (long)paVar11 >> 2) * -0x5555555555555555;
        if (uVar32 <= uVar16 && uVar16 - uVar32 != 0) goto LAB_0034247a;
        local_280 = normals;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
        iVar26 = 0x77f;
LAB_00342c9f:
        poVar15 = (ostream *)::std::ostream::operator<<(local_228,iVar26);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
        pcVar27 = "Invalid normals.size.";
        lVar24 = 0x15;
      }
      else {
        local_280 = normals;
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                   ,0x5b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
        iVar26 = 0x77c;
LAB_003427e0:
        poVar15 = (ostream *)::std::ostream::operator<<(local_228,iVar26);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
        pcVar27 = "Invalid texcoords.size.";
        lVar24 = 0x17;
      }
      goto LAB_003422a0;
    }
    local_280 = normals;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_228);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
               ,0x5b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"ComputeTangentsAndBinormals",0x1b);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"():",3);
    poVar15 = (ostream *)::std::ostream::operator<<((ostringstream *)local_228,0x779);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar15," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_228,"Invalid vertices.size.",0x16);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"\n",1);
    if (err == (string *)0x0) goto LAB_003422ff;
    ::std::__cxx11::stringbuf::str();
  }
  ::std::__cxx11::string::_M_append((char *)err,local_2d8._0_8_);
  if ((pointer)local_2d8._0_8_ != (pointer)(local_2d8 + 0x10)) {
    operator_delete((void *)local_2d8._0_8_,(ulong)((long)(float *)local_2d8._16_8_ + 1));
  }
LAB_003422ff:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_228);
  ::std::ios_base::~ios_base(local_1b8);
  return false;
}

Assistant:

static bool ComputeTangentsAndBinormals(
    const std::vector<vec3> &vertices,
    const std::vector<uint32_t> &faceVertexCounts,
    const std::vector<uint32_t> &faceVertexIndices,
    const std::vector<vec2> &texcoords, const std::vector<vec3> &normals,
    bool is_facevarying_input,  // false: 'vertex' varying
    std::vector<vec3> *tangents, std::vector<vec3> *binormals,
    std::vector<uint32_t> *out_vertex_indices, std::string *err) {
  if (!tangents) {
    PUSH_ERROR_AND_RETURN("tangents arg is nullptr.");
  }

  if (!binormals) {
    PUSH_ERROR_AND_RETURN("binormals arg is nullptr.");
  }

  if (!out_vertex_indices) {
    PUSH_ERROR_AND_RETURN("out_indices arg is nullptr.");
  }

  if (vertices.empty()) {
    PUSH_ERROR_AND_RETURN("vertices is empty.");
  }

  // At least 1 triangle face should exist.
  if (faceVertexIndices.size() < 3) {
    PUSH_ERROR_AND_RETURN("faceVertexIndices.size < 3");
  }

  if (texcoords.empty()) {
    PUSH_ERROR_AND_RETURN("texcoords is empty");
  }

  if (normals.empty()) {
    PUSH_ERROR_AND_RETURN("normals is empty");
  }

  if (is_facevarying_input) {
    if (vertices.size() != faceVertexIndices.size()) {
      PUSH_ERROR_AND_RETURN("Invalid vertices.size.");
    }
    if (texcoords.size() != faceVertexIndices.size()) {
      PUSH_ERROR_AND_RETURN("Invalid texcoords.size.");
    }
    if (normals.size() != faceVertexIndices.size()) {
      PUSH_ERROR_AND_RETURN("Invalid normals.size.");
    }
  } else {
    uint32_t max_vert_index =
        *std::max_element(faceVertexIndices.begin(), faceVertexIndices.end());
    if (max_vert_index >= vertices.size()) {
      PUSH_ERROR_AND_RETURN("Invalid vertices.size.");
    }
    if (max_vert_index >= texcoords.size()) {
      PUSH_ERROR_AND_RETURN("Invalid texcoords.size.");
    }
    if (max_vert_index >= normals.size()) {
      PUSH_ERROR_AND_RETURN("Invalid normals.size.");
    }
  }

  bool hasFaceVertexCounts = true;
  if (faceVertexCounts.size() == 0) {
    // Assume all triangle faces.
    if ((faceVertexIndices.size() % 3) != 0) {
      PUSH_ERROR_AND_RETURN(
          "Invalid faceVertexIndices. It must be all triangles: "
          "faceVertexIndices.size % 3 == 0");
    }
    hasFaceVertexCounts = false;
  }

  // tn, bn = facevarying
  std::vector<value::normal3f> tn(faceVertexIndices.size());
  memset(&tn.at(0), 0, sizeof(value::normal3f) * tn.size());
  std::vector<value::normal3f> bn(faceVertexIndices.size());
  memset(&bn.at(0), 0, sizeof(value::normal3f) * bn.size());

  //
  // 1. Compute facevarying tangent/binormal for each faceVertex.
  //
  size_t faceVertexIndexOffset{0};
  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    size_t nv = hasFaceVertexCounts ? faceVertexCounts[i] : 3;

    if ((faceVertexIndexOffset + nv) >= faceVertexIndices.size()) {
      // Invalid faceVertexIndices
      PUSH_ERROR_AND_RETURN("Invalid value in faceVertexOffset.");
    }

    if (nv < 3) {
      PUSH_ERROR_AND_RETURN("Degenerated facet found.");
    }

    // Process each two-edges per facet.
    //
    // Example:
    //
    // fv3
    //  o----------------o fv2
    //   \              /
    //    \            /
    //     o----------o
    //    fv0         fv1

    // facet0:  fv0, fv1, fv2
    // facet1:  fv1, fv2, fv3

    for (size_t f = 0; f < nv - 2; f++) {
      size_t fid0 = faceVertexIndexOffset + f;
      size_t fid1 = faceVertexIndexOffset + f + 1;
      size_t fid2 = faceVertexIndexOffset + f + 2;

      uint32_t vf0 =
          is_facevarying_input ? uint32_t(fid0) : faceVertexIndices[fid0];
      uint32_t vf1 =
          is_facevarying_input ? uint32_t(fid1) : faceVertexIndices[fid1];
      uint32_t vf2 =
          is_facevarying_input ? uint32_t(fid2) : faceVertexIndices[fid2];

      if ((vf0 >= vertices.size()) || (vf1 >= vertices.size()) ||
          (vf2 >= vertices.size())) {
        // index out-of-range
        PUSH_ERROR_AND_RETURN(
            "Invalid value in faceVertexIndices. some exceeds vertices.size()");
      }

      vec3 v1 = vertices[vf0];
      vec3 v2 = vertices[vf1];
      vec3 v3 = vertices[vf2];

      float v1x = v1[0];
      float v1y = v1[1];
      float v1z = v1[2];

      float v2x = v2[0];
      float v2y = v2[1];
      float v2z = v2[2];

      float v3x = v3[0];
      float v3y = v3[1];
      float v3z = v3[2];

      float w1x = 0.0f;
      float w1y = 0.0f;
      float w2x = 0.0f;
      float w2y = 0.0f;
      float w3x = 0.0f;
      float w3y = 0.0f;

      if ((vf0 >= texcoords.size()) || (vf1 >= texcoords.size()) ||
          (vf2 >= texcoords.size())) {
        // index out-of-range
        PUSH_ERROR_AND_RETURN("Invalid index. some exceeds texcoords.size()");
      }

      {
        vec2 uv1 = texcoords[vf0];
        vec2 uv2 = texcoords[vf1];
        vec2 uv3 = texcoords[vf2];

        w1x = uv1[0];
        w1y = uv1[1];
        w2x = uv2[0];
        w2y = uv2[1];
        w3x = uv3[0];
        w3y = uv3[1];
      }

      float x1 = v2x - v1x;
      float x2 = v3x - v1x;
      float y1 = v2y - v1y;
      float y2 = v3y - v1y;
      float z1 = v2z - v1z;
      float z2 = v3z - v1z;

      float s1 = w2x - w1x;
      float s2 = w3x - w1x;
      float t1 = w2y - w1y;
      float t2 = w3y - w1y;

      float r = 1.0;

      if (std::fabs(double(s1 * t2 - s2 * t1)) > 1.0e-20) {
        r /= (s1 * t2 - s2 * t1);
      }

      vec3 tdir{(t2 * x1 - t1 * x2) * r, (t2 * y1 - t1 * y2) * r,
                (t2 * z1 - t1 * z2) * r};
      vec3 bdir{(s1 * x2 - s2 * x1) * r, (s1 * y2 - s2 * y1) * r,
                (s1 * z2 - s2 * z1) * r};

      //
      // NOTE: for quad or polygon mesh, this overwrites previous 2 facevarying
      // points for each face.
      //       And this would not be a good way to compute tangents for
      //       quad/polygon.
      //

      tn[fid0][0] = tdir[0];
      tn[fid0][1] = tdir[1];
      tn[fid0][2] = tdir[2];

      tn[fid1][0] = tdir[0];
      tn[fid1][1] = tdir[1];
      tn[fid1][2] = tdir[2];

      tn[fid2][0] = tdir[0];
      tn[fid2][1] = tdir[1];
      tn[fid2][2] = tdir[2];

      bn[fid0][0] = bdir[0];
      bn[fid0][1] = bdir[1];
      bn[fid0][2] = bdir[2];

      bn[fid1][0] = bdir[0];
      bn[fid1][1] = bdir[1];
      bn[fid1][2] = bdir[2];

      bn[fid2][0] = bdir[0];
      bn[fid2][1] = bdir[1];
      bn[fid2][2] = bdir[2];
    }

    faceVertexIndexOffset += nv;
  }

  //
  // 2. Build indices(use same index for shared-vertex)
  //
  std::vector<uint32_t> vertex_indices;  // len = faceVertexIndices.size()
  {
    ComputeTangentVertexInput<ComputeTangentPackedVertexData> vertex_input;
    ComputeTangentVertexOutput<ComputeTangentPackedVertexData> vertex_output;

    if (is_facevarying_input) {
      // input position is still in 'vertex' variability.
      for (size_t i = 0; i < faceVertexIndices.size(); i++) {
        vertex_input.point_indices.push_back(faceVertexIndices[i]);
      }
      vertex_input.normals = normals;
      vertex_input.uvs = texcoords;
    } else {
      // expand to facevarying.
      for (size_t i = 0; i < faceVertexIndices.size(); i++) {
        vertex_input.point_indices.push_back(faceVertexIndices[i]);
        vertex_input.normals.push_back(normals[faceVertexIndices[i]]);
        vertex_input.uvs.push_back(texcoords[faceVertexIndices[i]]);
      }
    }

    std::vector<uint32_t> vertex_point_indices;

    BuildIndices<ComputeTangentVertexInput<ComputeTangentPackedVertexData>,
                 ComputeTangentVertexOutput<ComputeTangentPackedVertexData>,
                 ComputeTangentPackedVertexData,
                 ComputeTangentPackedVertexDataHasher,
                 ComputeTangentPackedVertexDataEqual>(
        vertex_input, vertex_output, vertex_indices, vertex_point_indices);

    DCOUT("faceVertexIndices.size : " << faceVertexIndices.size());
    DCOUT("# of indices after the build: "
          << vertex_indices.size() << ", reduced "
          << (faceVertexIndices.size() - vertex_indices.size()) << " indices.");
    // We only need indices. Discard vertex_output and vertrex_point_indices
  }

  const uint32_t num_verts =
      *std::max_element(vertex_indices.begin(), vertex_indices.end());

  //
  // 3. normalize * orthogonalize;
  //

  // per-vertex tangents/binormals
  std::vector<value::normal3f> v_tn;
  v_tn.assign(num_verts, {0.0f, 0.0f, 0.0f});

  std::vector<value::normal3f> v_bn;
  v_bn.assign(num_verts, {0.0f, 0.0f, 0.0f});

  for (size_t i = 0; i < vertex_indices.size(); i++) {
    value::normal3f Tn = tn[vertex_indices[i]];
    value::normal3f Bn = bn[vertex_indices[i]];

    v_tn[vertex_indices[i]][0] += Tn[0];
    v_tn[vertex_indices[i]][1] += Tn[1];
    v_tn[vertex_indices[i]][2] += Tn[2];

    v_bn[vertex_indices[i]][0] += Bn[0];
    v_bn[vertex_indices[i]][1] += Bn[1];
    v_bn[vertex_indices[i]][2] += Bn[2];
  }

  for (size_t i = 0; i < size_t(num_verts); i++) {
    if (vlength(v_tn[i]) > 0.0f) {
      v_tn[i] = vnormalize(v_tn[i]);
    }
    if (vlength(v_bn[i]) > 0.0f) {
      v_bn[i] = vnormalize(v_bn[i]);
    }
  }

  tangents->assign(num_verts, {0.0f, 0.0f, 0.0f});
  binormals->assign(num_verts, {0.0f, 0.0f, 0.0f});

  for (size_t i = 0; i < vertex_indices.size(); i++) {
    value::normal3f n;

    // http://www.terathon.com/code/tangent.html

    n[0] = normals[vertex_indices[i]][0];
    n[1] = normals[vertex_indices[i]][1];
    n[2] = normals[vertex_indices[i]][2];

    value::normal3f Tn = v_tn[vertex_indices[i]];
    value::normal3f Bn = v_bn[vertex_indices[i]];

    // Gram-Schmidt orthogonalize
    Tn = (Tn - n * vdot(n, Tn));
    if (vlength(Tn) > 0.0f) {
      Tn = vnormalize(Tn);
    }

    // Calculate handedness
    if (vdot(vcross(n, Tn), Bn) < 0.0f) {
      Tn = Tn * -1.0f;
    }

    ((*tangents)[vertex_indices[i]])[0] = Tn[0];
    ((*tangents)[vertex_indices[i]])[1] = Tn[1];
    ((*tangents)[vertex_indices[i]])[2] = Tn[2];

    ((*binormals)[vertex_indices[i]])[0] = Bn[0];
    ((*binormals)[vertex_indices[i]])[1] = Bn[1];
    ((*binormals)[vertex_indices[i]])[2] = Bn[2];
  }

  (*out_vertex_indices) = vertex_indices;

  return true;
}